

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O3

vector<wallet::CKeyPool,_std::allocator<wallet::CKeyPool>_> * __thiscall
wallet::LegacyScriptPubKeyMan::MarkReserveKeysAsUsed
          (vector<wallet::CKeyPool,_std::allocator<wallet::CKeyPool>_> *__return_storage_ptr__,
          LegacyScriptPubKeyMan *this,int64_t keypool_id)

{
  _Base_ptr params;
  _Rb_tree_header *p_Var1;
  map<CKeyID,_long,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_long>_>_> *this_00;
  iterator __position;
  bool bVar2;
  int iVar3;
  _Base_ptr p_Var4;
  undefined4 extraout_var;
  iterator __position_00;
  _Base_ptr p_Var6;
  long lVar7;
  CKeyPool *pCVar8;
  iterator iVar9;
  long in_FS_OFFSET;
  byte bVar10;
  pair<std::_Rb_tree_iterator<std::pair<const_CKeyID,_long>_>,_std::_Rb_tree_iterator<std::pair<const_CKeyID,_long>_>_>
  pVar11;
  CKeyPool keypool;
  _Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>> *local_c8;
  WalletBatch local_b0;
  CKeyID local_9c;
  CKeyPool local_88;
  long local_38;
  WalletDatabase *pWVar5;
  
  bVar10 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  p_Var4 = (this->super_LegacyDataSPKM).setInternalKeyPool._M_t._M_impl.super__Rb_tree_header.
           _M_header._M_parent;
  if (p_Var4 != (_Base_ptr)0x0) {
    p_Var1 = &(this->super_LegacyDataSPKM).setInternalKeyPool._M_t._M_impl.super__Rb_tree_header;
    p_Var6 = &p_Var1->_M_header;
    do {
      if (keypool_id <= *(long *)(p_Var4 + 1)) {
        p_Var6 = p_Var4;
      }
      p_Var4 = (&p_Var4->_M_left)[*(long *)(p_Var4 + 1) < keypool_id];
    } while (p_Var4 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var6 != p_Var1) &&
       (local_c8 = (_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>> *)
                   &(this->super_LegacyDataSPKM).setInternalKeyPool,
       *(long *)(p_Var6 + 1) <= keypool_id)) goto LAB_00212e9f;
  }
  p_Var4 = (this->super_LegacyDataSPKM).setExternalKeyPool._M_t._M_impl.super__Rb_tree_header.
           _M_header._M_parent;
  if (p_Var4 == (_Base_ptr)0x0) {
LAB_00212e3c:
    p_Var4 = (this->super_LegacyDataSPKM).set_pre_split_keypool._M_t._M_impl.super__Rb_tree_header.
             _M_header._M_parent;
    if (p_Var4 == (_Base_ptr)0x0) {
LAB_0021300f:
      __assert_fail("setExternalKeyPool.count(keypool_id) || set_pre_split_keypool.count(keypool_id)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/scriptpubkeyman.cpp"
                    ,0x5ec,
                    "std::vector<CKeyPool> wallet::LegacyScriptPubKeyMan::MarkReserveKeysAsUsed(int64_t)"
                   );
    }
    p_Var1 = &(this->super_LegacyDataSPKM).set_pre_split_keypool._M_t._M_impl.super__Rb_tree_header;
    p_Var6 = &p_Var1->_M_header;
    do {
      if (keypool_id <= *(long *)(p_Var4 + 1)) {
        p_Var6 = p_Var4;
      }
      p_Var4 = (&p_Var4->_M_left)[*(long *)(p_Var4 + 1) < keypool_id];
    } while (p_Var4 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var6 == p_Var1) || (keypool_id < *(long *)(p_Var6 + 1)))
    goto LAB_0021300f;
  }
  else {
    p_Var1 = &(this->super_LegacyDataSPKM).setExternalKeyPool._M_t._M_impl.super__Rb_tree_header;
    p_Var6 = &p_Var1->_M_header;
    do {
      if (keypool_id <= *(long *)(p_Var4 + 1)) {
        p_Var6 = p_Var4;
      }
      p_Var4 = (&p_Var4->_M_left)[*(long *)(p_Var4 + 1) < keypool_id];
    } while (p_Var4 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var6 == p_Var1) || (keypool_id < *(long *)(p_Var6 + 1)))
    goto LAB_00212e3c;
  }
  local_c8 = (_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>> *)
             &(this->super_LegacyDataSPKM).set_pre_split_keypool;
  if ((this->super_LegacyDataSPKM).set_pre_split_keypool._M_t._M_impl.super__Rb_tree_header.
      _M_node_count == 0) {
    local_c8 = (_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>> *)
               &(this->super_LegacyDataSPKM).setExternalKeyPool;
  }
LAB_00212e9f:
  __position_00._M_node = *(_Base_ptr *)(local_c8 + 0x18);
  (__return_storage_ptr__->super__Vector_base<wallet::CKeyPool,_std::allocator<wallet::CKeyPool>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<wallet::CKeyPool,_std::allocator<wallet::CKeyPool>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<wallet::CKeyPool,_std::allocator<wallet::CKeyPool>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar3 = (*((this->super_LegacyDataSPKM).super_ScriptPubKeyMan.m_storage)->_vptr_WalletStorage[3])
                    ();
  pWVar5 = (WalletDatabase *)CONCAT44(extraout_var,iVar3);
  (*pWVar5->_vptr_WalletDatabase[0xe])(&local_b0,pWVar5,1);
  local_b0.m_database = pWVar5;
  if (__position_00._M_node != (_Base_ptr)(local_c8 + 8)) {
    this_00 = &(this->super_LegacyDataSPKM).m_pool_key_to_index;
    do {
      if (keypool_id < *(long *)(__position_00._M_node + 1)) break;
      CKeyPool::CKeyPool(&local_88);
      params = __position_00._M_node + 1;
      bVar2 = WalletBatch::ReadPool(&local_b0,*(int64_t *)params,&local_88);
      if (bVar2) {
        CPubKey::GetID(&local_9c,&local_88.vchPubKey);
        pVar11 = std::
                 _Rb_tree<CKeyID,_std::pair<const_CKeyID,_long>,_std::_Select1st<std::pair<const_CKeyID,_long>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_long>_>_>
                 ::equal_range(&this_00->_M_t,&local_9c);
        std::
        _Rb_tree<CKeyID,_std::pair<const_CKeyID,_long>,_std::_Select1st<std::pair<const_CKeyID,_long>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_long>_>_>
        ::_M_erase_aux(&this_00->_M_t,(_Base_ptr)pVar11.first._M_node,
                       (_Base_ptr)pVar11.second._M_node);
      }
      LearnRelatedScripts(this,&local_88.vchPubKey,P2SH_SEGWIT);
      WalletBatch::ErasePool(&local_b0,*(int64_t *)params);
      ScriptPubKeyMan::WalletLogPrintf<long>
                ((ScriptPubKeyMan *)this,(ConstevalFormatString<1U>)0x4a3161,(long *)params);
      __position_00 =
           std::_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>>::
           erase_abi_cxx11_(local_c8,__position_00._M_node);
      __position._M_current =
           (__return_storage_ptr__->
           super__Vector_base<wallet::CKeyPool,_std::allocator<wallet::CKeyPool>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (__return_storage_ptr__->
          super__Vector_base<wallet::CKeyPool,_std::allocator<wallet::CKeyPool>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<wallet::CKeyPool,_std::allocator<wallet::CKeyPool>_>::
        _M_realloc_insert<wallet::CKeyPool>(__return_storage_ptr__,__position,&local_88);
      }
      else {
        pCVar8 = &local_88;
        iVar9._M_current = __position._M_current;
        for (lVar7 = 10; lVar7 != 0; lVar7 = lVar7 + -1) {
          (iVar9._M_current)->nTime = pCVar8->nTime;
          pCVar8 = (CKeyPool *)((long)pCVar8 + (ulong)bVar10 * -0x10 + 8);
          iVar9._M_current = iVar9._M_current + (ulong)bVar10 * -0x10 + 8;
        }
        (__return_storage_ptr__->
        super__Vector_base<wallet::CKeyPool,_std::allocator<wallet::CKeyPool>_>)._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
    } while (__position_00._M_node != (_Base_ptr)(local_c8 + 8));
  }
  if ((_Head_base<0UL,_wallet::DatabaseBatch_*,_false>)
      local_b0.m_batch._M_t.
      super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>._M_t
      .super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>.
      super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl !=
      (_Head_base<0UL,_wallet::DatabaseBatch_*,_false>)0x0) {
    (*(*(_func_int ***)
        local_b0.m_batch._M_t.
        super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>.
        _M_t.
        super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
        .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl)[5])();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<CKeyPool> LegacyScriptPubKeyMan::MarkReserveKeysAsUsed(int64_t keypool_id)
{
    AssertLockHeld(cs_KeyStore);
    bool internal = setInternalKeyPool.count(keypool_id);
    if (!internal) assert(setExternalKeyPool.count(keypool_id) || set_pre_split_keypool.count(keypool_id));
    std::set<int64_t> *setKeyPool = internal ? &setInternalKeyPool : (set_pre_split_keypool.empty() ? &setExternalKeyPool : &set_pre_split_keypool);
    auto it = setKeyPool->begin();

    std::vector<CKeyPool> result;
    WalletBatch batch(m_storage.GetDatabase());
    while (it != std::end(*setKeyPool)) {
        const int64_t& index = *(it);
        if (index > keypool_id) break; // set*KeyPool is ordered

        CKeyPool keypool;
        if (batch.ReadPool(index, keypool)) { //TODO: This should be unnecessary
            m_pool_key_to_index.erase(keypool.vchPubKey.GetID());
        }
        LearnAllRelatedScripts(keypool.vchPubKey);
        batch.ErasePool(index);
        WalletLogPrintf("keypool index %d removed\n", index);
        it = setKeyPool->erase(it);
        result.push_back(std::move(keypool));
    }

    return result;
}